

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O3

void TvCtrlPointHandleSubscribeUpdate(char *eventURL,char *sid,int timeout)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  TvDeviceNode *pTVar4;
  long lVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  pTVar4 = GlobalDeviceList;
  do {
    if (pTVar4 == (TvDeviceNode *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
      return;
    }
    lVar5 = 0;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      iVar2 = strcmp((pTVar4->device).TvService[lVar5].EventURL,eventURL);
      if (iVar2 == 0) {
        SampleUtil_Print("Received Tv %s Event Renewal for eventURL %s\n",TvServiceName[lVar5],
                         eventURL);
        strcpy((pTVar4->device).TvService[lVar5].SID,sid);
        break;
      }
      lVar5 = 1;
      bVar1 = false;
    } while (bVar3);
    pTVar4 = pTVar4->next;
  } while( true );
}

Assistant:

void TvCtrlPointHandleSubscribeUpdate(
	const char *eventURL, const Upnp_SID sid, int timeout)
{
	struct TvDeviceNode *tmpdevnode;
	int service;
	(void)timeout;

	ithread_mutex_lock(&DeviceListMutex);

	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (strcmp(tmpdevnode->device.TvService[service]
					    .EventURL,
				    eventURL) == 0) {
				SampleUtil_Print("Received Tv %s Event Renewal "
						 "for eventURL %s\n",
					TvServiceName[service],
					eventURL);
				strcpy(tmpdevnode->device.TvService[service]
						.SID,
					sid);
				break;
			}
		}

		tmpdevnode = tmpdevnode->next;
	}

	ithread_mutex_unlock(&DeviceListMutex);

	return;
}